

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lz4.c
# Opt level: O1

void test_write_filter_lz4(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  char *pcVar4;
  void *pvVar5;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  char *e1;
  longlong lVar8;
  ulong uVar9;
  uint uVar10;
  longlong v1;
  archive_entry *ae;
  size_t used2;
  size_t used1;
  char path [16];
  archive_entry *local_78;
  void *local_70;
  uint local_68;
  undefined4 uStack_64;
  void *local_60;
  longlong local_58;
  uint local_50;
  undefined4 uStack_4c;
  char local_48 [16];
  char *local_38;
  
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'+',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_add_filter_lz4(paVar3);
  pcVar4 = archive_liblz4_version();
  if (pcVar4 == (char *)0x0) {
    wVar2 = canLz4();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'/');
      test_skipping("lz4 writing not supported on this platform");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'0',-0x14,"ARCHIVE_WARN",(long)iVar1,"r",(void *)0x0);
      iVar1 = archive_write_free(paVar3);
      pcVar4 = "archive_write_free(a)";
      wVar2 = L'1';
      goto LAB_001d6ac3;
    }
    e1 = "ARCHIVE_WARN";
    v1 = -0x14;
    wVar2 = L'4';
    lVar8 = -0x14;
  }
  else {
    e1 = "ARCHIVE_OK";
    v1 = 0;
    wVar2 = L'8';
    lVar8 = 0;
  }
  local_38 = pcVar4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,wVar2,lVar8,e1,(long)iVar1,"r",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L':',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  pvVar5 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'=',(uint)(pvVar5 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  local_60 = calloc(10000,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'@',(uint)(local_60 != (void *)0x0),"NULL != (data = calloc(datasize, 1))",
                   (void *)0x0);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'F',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'G',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar3);
  iVar1 = archive_write_add_filter_lz4(paVar3);
  local_58 = v1;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'I',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lz4(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,0x400);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 1024)",
                      paVar3);
  iVar1 = archive_write_set_bytes_in_last_block(paVar3,0x400);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_bytes_in_last_block(a, 1024)",paVar3);
  iVar1 = archive_filter_code(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'N',0xd,"ARCHIVE_FILTER_LZ4",(long)iVar1,"archive_filter_code(a, 0)",
                      (void *)0x0);
  pcVar4 = archive_filter_name(paVar3,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
             ,L'O',"lz4","\"lz4\"",pcVar4,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  local_70 = pvVar5;
  iVar1 = archive_write_open_memory(paVar3,pvVar5,2000000,(size_t *)&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'Q',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used1)",paVar3);
  local_78 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'R',(uint)(local_78 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_filetype(local_78,0x8000);
  archive_entry_set_size(local_78,10000);
  uVar9 = 0;
  do {
    snprintf(local_48,0x10,"file%03d",uVar9);
    archive_entry_copy_pathname(local_78,local_48);
    iVar1 = archive_write_header(paVar3,local_78);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
    lVar6 = archive_write_data(paVar3,local_60,10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'Z',(uint)(lVar6 == 10000),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar3);
    uVar10 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar10;
  } while (uVar10 != 10);
  archive_entry_free(local_78);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L']',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'`',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,L'a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_lz4(paVar3);
  if (iVar1 != -0x14) {
    iVar1 = archive_read_open_memory(paVar3,local_70,CONCAT44(uStack_4c,local_50));
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used1)",
                        paVar3);
    uVar9 = 0;
    do {
      snprintf(local_48,0x10,"file%03d",uVar9);
      iVar1 = archive_read_next_header(paVar3,&local_78);
      wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                                  ,L'o',0,"ARCHIVE_OK",(long)iVar1,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar2 == L'\0') break;
      pcVar4 = archive_entry_pathname(local_78);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                 ,L'q',local_48,"path",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar7 = archive_entry_size(local_78);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'r',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",(void *)0x0);
      uVar10 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar10;
    } while (uVar10 != 10);
    iVar1 = archive_read_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
    iVar1 = archive_read_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'u',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    paVar3 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'{',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar3)
    ;
    iVar1 = archive_write_set_bytes_per_block(paVar3,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",
                        paVar3);
    iVar1 = archive_write_add_filter_lz4(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x80',local_58,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                        "archive_write_add_filter_lz4(a)",paVar3);
    iVar1 = archive_write_set_options(paVar3,"lz4:nonexistent-option=0");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x82',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                        "archive_write_set_options(a, \"lz4:nonexistent-option=0\")",paVar3);
    iVar1 = archive_write_set_options(paVar3,"lz4:compression-level=1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_options(a, \"lz4:compression-level=1\")",paVar3);
    iVar1 = archive_write_set_filter_option(paVar3,(char *)0x0,"compression-level","9");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")",
                        paVar3);
    iVar1 = archive_write_set_filter_option(paVar3,(char *)0x0,"compression-level","abc");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x88',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                        "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")",
                        paVar3);
    iVar1 = archive_write_set_filter_option(paVar3,(char *)0x0,"compression-level","99");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x8a',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                        "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")",
                        paVar3);
    iVar1 = archive_write_set_options(paVar3,"lz4:compression-level=9");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x8c',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_options(a, \"lz4:compression-level=9\")",paVar3);
    iVar1 = archive_write_open_memory(paVar3,local_70,2000000,(size_t *)&local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x8e',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, buffsize, &used2)",paVar3);
    pvVar5 = local_60;
    uVar9 = 0;
    do {
      snprintf(local_48,0x10,"file%03d",uVar9);
      local_78 = archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                       ,L'\x91',(uint)(local_78 != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_copy_pathname(local_78,local_48);
      archive_entry_set_size(local_78,10000);
      archive_entry_set_filetype(local_78,0x8000);
      iVar1 = archive_write_header(paVar3,local_78);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
      lVar6 = archive_write_data(paVar3,pvVar5,10000);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                       ,L'\x97',(uint)(lVar6 == 10000),
                       "datasize == (size_t)archive_write_data( a, data, datasize)",paVar3);
      archive_entry_free(local_78);
      uVar10 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar10;
    } while (uVar10 != 10);
    iVar1 = archive_write_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x9a',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    failure("compression-level=9 wrote %d bytes, default wrote %d bytes",(ulong)local_68,
            (ulong)local_50);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'\x9f',(uint)(CONCAT44(uStack_64,local_68) < CONCAT44(uStack_4c,local_50)),
                     "used2 < used1",(void *)0x0);
    paVar3 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'¡',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'¢',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar3);
    iVar1 = archive_read_support_filter_lz4(paVar3);
    if ((local_38 == (char *)0x0) || (iVar1 == 0)) {
      iVar1 = archive_read_support_filter_all(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'¨',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar3);
      iVar1 = archive_read_open_memory(paVar3,local_70,CONCAT44(uStack_64,local_68));
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'ª',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_open_memory(a, buff, used2)",paVar3);
      uVar9 = 0;
      do {
        snprintf(local_48,0x10,"file%03d",uVar9);
        iVar1 = archive_read_next_header(paVar3,&local_78);
        wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                                    ,L'®',0,"ARCHIVE_OK",(long)iVar1,
                                    "archive_read_next_header(a, &ae)",(void *)0x0);
        if (wVar2 == L'\0') break;
        pcVar4 = archive_entry_pathname(local_78);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'°',local_48,"path",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        lVar7 = archive_entry_size(local_78);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                            ,L'±',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",(void *)0x0)
        ;
        uVar10 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar10;
      } while (uVar10 != 10);
      iVar1 = archive_read_close(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'¥');
      test_skipping("lz4 reading not fully supported on this platform");
    }
    iVar1 = archive_read_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'µ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    paVar3 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'º',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'»',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar3
                       );
    iVar1 = archive_write_set_bytes_per_block(paVar3,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'½',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)"
                        ,paVar3);
    iVar1 = archive_write_add_filter_lz4(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'¿',local_58,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                        "archive_write_add_filter_lz4(a)",paVar3);
    iVar1 = archive_write_set_filter_option(paVar3,(char *)0x0,"compression-level","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Á',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")",
                        paVar3);
    iVar1 = archive_write_open_memory(paVar3,local_70,2000000,(size_t *)&local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, buffsize, &used2)",paVar3);
    pvVar5 = local_60;
    uVar9 = 0;
    do {
      snprintf(local_48,0x10,"file%03d",uVar9);
      local_78 = archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                       ,L'Æ',(uint)(local_78 != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_copy_pathname(local_78,local_48);
      archive_entry_set_size(local_78,10000);
      archive_entry_set_filetype(local_78,0x8000);
      iVar1 = archive_write_header(paVar3,local_78);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
      failure("Writing file %s",local_48);
      lVar6 = archive_write_data(paVar3,pvVar5,10000);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'Í',10000,"datasize",lVar6,
                          "(size_t)archive_write_data(a, data, datasize)",paVar3);
      archive_entry_free(local_78);
      uVar10 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar10;
    } while (uVar10 != 10);
    iVar1 = archive_write_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Ð',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Ñ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    paVar3 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'Ù',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar3);
    iVar1 = archive_read_support_filter_all(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Û',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar3);
    iVar1 = archive_read_support_filter_lz4(paVar3);
    if (iVar1 == -0x14) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'Þ');
      test_skipping("lz4 reading not fully supported on this platform");
    }
    else {
      iVar1 = archive_read_open_memory(paVar3,local_70,CONCAT44(uStack_64,local_68));
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'á',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_open_memory(a, buff, used2)",paVar3);
      uVar9 = 0;
      do {
        snprintf(local_48,0x10,"file%03d",uVar9);
        iVar1 = archive_read_next_header(paVar3,&local_78);
        wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                                    ,L'å',0,"ARCHIVE_OK",(long)iVar1,
                                    "archive_read_next_header(a, &ae)",(void *)0x0);
        if (wVar2 == L'\0') break;
        pcVar4 = archive_entry_pathname(local_78);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                   ,L'ç',local_48,"path",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        lVar7 = archive_entry_size(local_78);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                            ,L'è',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",(void *)0x0)
        ;
        uVar10 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar10;
      } while (uVar10 != 10);
      iVar1 = archive_read_close(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                          ,L'ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
    }
    iVar1 = archive_read_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ì',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    paVar3 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'ò',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_add_filter_lz4(paVar3);
    lVar8 = local_58;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ô',local_58,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                        "archive_write_add_filter_lz4(a)",paVar3);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'õ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    paVar3 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'÷',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_add_filter_lz4(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ù',lVar8,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                        "archive_write_add_filter_lz4(a)",paVar3);
    iVar1 = archive_write_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ú',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'û',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    paVar3 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'ý',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'þ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar3
                       );
    iVar1 = archive_write_add_filter_lz4(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Ā',lVar8,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                        "archive_write_add_filter_lz4(a)",paVar3);
    iVar1 = archive_write_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ā',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Ă',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    paVar3 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                     ,L'Ą',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ą',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar3
                       );
    iVar1 = archive_write_add_filter_lz4(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ć',lVar8,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                        "archive_write_add_filter_lz4(a)",paVar3);
    pvVar5 = local_70;
    iVar1 = archive_write_open_memory(paVar3,local_70,2000000,(size_t *)&local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ĉ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, buffsize, &used2)",paVar3);
    iVar1 = archive_write_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'Ċ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                        ,L'ċ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    free(local_60);
    free(pvVar5);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                 ,L'd');
  test_skipping(
               "Can\'t verify lz4 writing by reading back; lz4 reading not fully supported on this platform"
               );
  iVar1 = archive_read_free(paVar3);
  pcVar4 = "archive_read_free(a)";
  wVar2 = L'f';
LAB_001d6ac3:
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lz4.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar4,(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lz4)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog = 0, filecount;

	assert((a = archive_write_new()) != NULL);
	r = archive_write_add_filter_lz4(a);
	if (archive_liblz4_version() == NULL) {
		if (!canLz4()) {
			skipping("lz4 writing not supported on this platform");
			assertEqualInt(ARCHIVE_WARN, r);
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			return;
		} else {
			assertEqualInt(ARCHIVE_WARN, r);
			use_prog = 1;
		}
	} else {
		assertEqualInt(ARCHIVE_OK, r);
	}
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = calloc(datasize, 1)));
	filecount = 10;

	/*
	 * Write a filecount files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lz4(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 1024));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_in_last_block(a, 1024));
	assertEqualInt(ARCHIVE_FILTER_LZ4, archive_filter_code(a, 0));
	assertEqualString("lz4", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lz4(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify lz4 writing by reading back;"
		    " lz4 reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1));
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		if (!assertEqualInt(ARCHIVE_OK,
			archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lz4(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_options(a, "lz4:nonexistent-option=0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "lz4:compression-level=1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "lz4:compression-level=9"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(
		    a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lz4(a);
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("lz4 reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lz4(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

#if 0
	failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);
#endif

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_lz4(a);
	if (r == ARCHIVE_WARN) {
		skipping("lz4 reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lz4(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lz4(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lz4(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lz4(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}